

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

Names * __thiscall
cmGeneratorTarget::GetExecutableNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  bool local_20d;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  string suffix;
  string prefix;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  cmValue local_c0;
  cmValue version;
  cmAlphaNum local_88;
  undefined1 local_58 [8];
  string msg;
  string *config_local;
  cmGeneratorTarget *this_local;
  Names *targetNames;
  
  Names::Names(__return_storage_ptr__);
  bVar1 = IsImported(this);
  if (bVar1) {
    cmAlphaNum::cmAlphaNum(&local_88,"GetExecutableNames called on imported target: ");
    psVar3 = GetName_abi_cxx11_(this);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&version,psVar3);
    cmStrCat<>((string *)local_58,&local_88,(cmAlphaNum *)&version);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"VERSION",&local_e1);
  local_c0 = GetProperty(this,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  prefix.field_2._M_local_buf[0xe] = '\0';
  prefix.field_2._M_local_buf[0xd] = '\0';
  TVar2 = GetType(this);
  local_20d = true;
  if (TVar2 == EXECUTABLE) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    prefix.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"XCODE",(allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
    prefix.field_2._M_local_buf[0xd] = '\x01';
    local_20d = cmMakefile::IsOn(this_00,&local_108);
  }
  if ((prefix.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_108);
  }
  if ((prefix.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
  }
  if (local_20d != false) {
    cmValue::operator=(&local_c0,(nullptr_t)0x0);
  }
  std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_150);
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,(string *)(suffix.field_2._M_local_buf + 8),
                      &__return_storage_ptr__->Base,(string *)local_150);
  std::operator+(&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8),&__return_storage_ptr__->Base);
  std::operator+(&local_170,&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Output,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->Real,(string *)&__return_storage_ptr__->Output);
  bVar1 = cmValue::operator_cast_to_bool(&local_c0);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->Real,"-");
    psVar3 = cmValue::operator*[abi_cxx11_(&local_c0);
    std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->Real,(string *)psVar3);
  }
  GetFullNameInternal(&local_1b0,this,config,ImportLibraryArtifact);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->ImportLibrary,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  GetPDBName(&local_1d0,this,config);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetExecutableNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = cmStrCat(
      "GetExecutableNames called on imported target: ", this->GetName());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

// This versioning is supported only for executables and then only
// when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmValue version;
#else
  // Check for executable version properties.
  cmValue version = this->GetProperty("VERSION");
  if (this->GetType() != cmStateEnums::EXECUTABLE ||
      this->Makefile->IsOn("XCODE")) {
    version = nullptr;
  }
#endif

  // Get the components of the executable name.
  std::string prefix;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, targetNames.Base, suffix);

  // The executable name.
  targetNames.Output = prefix + targetNames.Base + suffix;

// The executable's real name on disk.
#if defined(__CYGWIN__)
  targetNames.Real = prefix + targetNames.Base;
#else
  targetNames.Real = targetNames.Output;
#endif
  if (version) {
    targetNames.Real += "-";
    targetNames.Real += *version;
  }
#if defined(__CYGWIN__)
  targetNames.Real += suffix;
#endif

  // The import library name.
  targetNames.ImportLibrary =
    this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}